

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  uint *puVar1;
  int i;
  Status stat;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  pointer pnVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  fpclass_type fVar15;
  cpp_dec_float<100U,_int,_void> *pcVar16;
  long lVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  cpp_dec_float<100U,_int,_void> local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_90;
  DIdxSet *local_40;
  DIdxSet *local_38;
  
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->thePvec->thedelta);
  pUVar2 = this->thePvec;
  leavetol(&local_90,this);
  (this->updateViolsCo).super_IdxSet.num = 0;
  lVar17 = (long)(pUVar2->thedelta).super_IdxSet.num;
  if (0 < lVar17) {
    local_38 = &this->updateViolsCo;
    this_00 = &this->m_pricingViolCo;
    local_40 = &this->infeasibilitiesCo;
    lVar17 = lVar17 + 1;
    do {
      i = (pUVar2->thedelta).super_IdxSet.idx[lVar17 + -2];
      stat = ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.stat)->data[i];
      if (this->theRep * stat < 1) {
        if (this->m_pricingViolCoUpToDate == true) {
          pcVar16 = &(this->theTest).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
          local_e8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
          local_e8.data._M_elems[1] = local_90.m_backend.data._M_elems[1];
          uVar13 = local_e8.data._M_elems._0_8_;
          local_e8.data._M_elems[2] = local_90.m_backend.data._M_elems[2];
          local_e8.data._M_elems[3] = local_90.m_backend.data._M_elems[3];
          local_e8.data._M_elems[0xc] = local_90.m_backend.data._M_elems[0xc];
          local_e8.data._M_elems[0xd] = local_90.m_backend.data._M_elems[0xd];
          local_e8.data._M_elems[0xe] = local_90.m_backend.data._M_elems[0xe];
          local_e8.data._M_elems[0xf] = local_90.m_backend.data._M_elems[0xf];
          local_e8.data._M_elems[8] = local_90.m_backend.data._M_elems[8];
          local_e8.data._M_elems[9] = local_90.m_backend.data._M_elems[9];
          local_e8.data._M_elems[10] = local_90.m_backend.data._M_elems[10];
          local_e8.data._M_elems[0xb] = local_90.m_backend.data._M_elems[0xb];
          local_e8.data._M_elems[4] = local_90.m_backend.data._M_elems[4];
          local_e8.data._M_elems[5] = local_90.m_backend.data._M_elems[5];
          local_e8.data._M_elems[6] = local_90.m_backend.data._M_elems[6];
          local_e8.data._M_elems[7] = local_90.m_backend.data._M_elems[7];
          local_e8.exp = local_90.m_backend.exp;
          local_e8.neg = local_90.m_backend.neg;
          local_e8.fpclass = local_90.m_backend.fpclass;
          local_e8.prec_elem = local_90.m_backend.prec_elem;
          local_e8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
          if (local_e8.data._M_elems[0] != 0 || local_90.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_e8.neg = (bool)(local_90.m_backend.neg ^ 1);
          }
          local_e8.data._M_elems._0_8_ = uVar13;
          if (((local_90.m_backend.fpclass != cpp_dec_float_NaN) &&
              (pcVar16->fpclass != cpp_dec_float_NaN)) &&
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar16,&local_e8), iVar14 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (&this_00->m_backend,
                       &(this->theTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          }
        }
        test((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_e8,this,i,stat);
        pnVar3 = (this->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (uint *)((long)&pnVar3[i].m_backend.data + 0x30);
        *(undefined8 *)puVar1 = local_e8.data._M_elems._48_8_;
        *(undefined8 *)(puVar1 + 2) = local_e8.data._M_elems._56_8_;
        puVar1 = (uint *)((long)&pnVar3[i].m_backend.data + 0x20);
        *(undefined8 *)puVar1 = local_e8.data._M_elems._32_8_;
        *(undefined8 *)(puVar1 + 2) = local_e8.data._M_elems._40_8_;
        puVar1 = (uint *)((long)&pnVar3[i].m_backend.data + 0x10);
        *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_e8.data._M_elems._24_8_;
        *(undefined8 *)&pnVar3[i].m_backend.data = local_e8.data._M_elems._0_8_;
        *(undefined8 *)((long)&pnVar3[i].m_backend.data + 8) = local_e8.data._M_elems._8_8_;
        pnVar3[i].m_backend.exp = local_e8.exp;
        pnVar3[i].m_backend.neg = local_e8.neg;
        pnVar3[i].m_backend.fpclass = local_e8.fpclass;
        pnVar3[i].m_backend.prec_elem = local_e8.prec_elem;
        pcVar16 = &(this->theTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
        local_e8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
        uVar4 = local_e8.data._M_elems[0];
        fVar15 = local_90.m_backend.fpclass;
        if (this->sparsePricingEnterCo == true) {
          local_e8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
          local_e8.data._M_elems[1] = local_90.m_backend.data._M_elems[1];
          local_e8.data._M_elems[2] = local_90.m_backend.data._M_elems[2];
          local_e8.data._M_elems[3] = local_90.m_backend.data._M_elems[3];
          local_e8.data._M_elems[0xc] = local_90.m_backend.data._M_elems[0xc];
          local_e8.data._M_elems[0xd] = local_90.m_backend.data._M_elems[0xd];
          local_e8.data._M_elems[0xe] = local_90.m_backend.data._M_elems[0xe];
          local_e8.data._M_elems[0xf] = local_90.m_backend.data._M_elems[0xf];
          local_e8.data._M_elems[8] = local_90.m_backend.data._M_elems[8];
          local_e8.data._M_elems[9] = local_90.m_backend.data._M_elems[9];
          local_e8.data._M_elems[10] = local_90.m_backend.data._M_elems[10];
          local_e8.data._M_elems[0xb] = local_90.m_backend.data._M_elems[0xb];
          local_e8.data._M_elems[4] = local_90.m_backend.data._M_elems[4];
          local_e8.data._M_elems[5] = local_90.m_backend.data._M_elems[5];
          local_e8.data._M_elems[6] = local_90.m_backend.data._M_elems[6];
          local_e8.data._M_elems[7] = local_90.m_backend.data._M_elems[7];
          local_e8.exp = local_90.m_backend.exp;
          local_e8.neg = local_90.m_backend.neg;
          local_e8.fpclass = local_90.m_backend.fpclass;
          local_e8.prec_elem = local_90.m_backend.prec_elem;
          if (uVar4 != 0 || fVar15 != cpp_dec_float_finite) {
            local_e8.neg = (bool)(local_90.m_backend.neg ^ 1);
          }
          if (((fVar15 == cpp_dec_float_NaN) || (pcVar16->fpclass == cpp_dec_float_NaN)) ||
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar16,&local_e8), -1 < iVar14)) {
            (this->isInfeasibleCo).data[i] = 0;
            uVar5 = local_e8.data._M_elems._0_8_;
            uVar6 = local_e8.data._M_elems._8_8_;
            uVar7 = local_e8.data._M_elems._16_8_;
            uVar8 = local_e8.data._M_elems._24_8_;
            uVar9 = local_e8.data._M_elems._32_8_;
            uVar10 = local_e8.data._M_elems._40_8_;
            uVar11 = local_e8.data._M_elems._48_8_;
            uVar12 = local_e8.data._M_elems._56_8_;
            uVar13 = local_e8._72_8_;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       &(this->theTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
            if ((this->isInfeasibleCo).data[i] == 0) {
              DIdxSet::addIdx(local_40,i);
              (this->isInfeasibleCo).data[i] = 1;
            }
            uVar5 = local_e8.data._M_elems._0_8_;
            uVar6 = local_e8.data._M_elems._8_8_;
            uVar7 = local_e8.data._M_elems._16_8_;
            uVar8 = local_e8.data._M_elems._24_8_;
            uVar9 = local_e8.data._M_elems._32_8_;
            uVar10 = local_e8.data._M_elems._40_8_;
            uVar11 = local_e8.data._M_elems._48_8_;
            uVar12 = local_e8.data._M_elems._56_8_;
            uVar13 = local_e8._72_8_;
            if (this->hyperPricingEnter == true) {
              DIdxSet::addIdx(local_38,i);
              uVar5 = local_e8.data._M_elems._0_8_;
              uVar6 = local_e8.data._M_elems._8_8_;
              uVar7 = local_e8.data._M_elems._16_8_;
              uVar8 = local_e8.data._M_elems._24_8_;
              uVar9 = local_e8.data._M_elems._32_8_;
              uVar10 = local_e8.data._M_elems._40_8_;
              uVar11 = local_e8.data._M_elems._48_8_;
              uVar12 = local_e8.data._M_elems._56_8_;
              uVar13 = local_e8._72_8_;
            }
          }
        }
        else {
          uVar5._0_4_ = local_90.m_backend.data._M_elems[0];
          uVar5._4_4_ = local_90.m_backend.data._M_elems[1];
          uVar6._0_4_ = local_90.m_backend.data._M_elems[2];
          uVar6._4_4_ = local_90.m_backend.data._M_elems[3];
          uVar7._0_4_ = local_90.m_backend.data._M_elems[4];
          uVar7._4_4_ = local_90.m_backend.data._M_elems[5];
          uVar8._0_4_ = local_90.m_backend.data._M_elems[6];
          uVar8._4_4_ = local_90.m_backend.data._M_elems[7];
          uVar9._0_4_ = local_90.m_backend.data._M_elems[8];
          uVar9._4_4_ = local_90.m_backend.data._M_elems[9];
          uVar10._0_4_ = local_90.m_backend.data._M_elems[10];
          uVar10._4_4_ = local_90.m_backend.data._M_elems[0xb];
          uVar11._0_4_ = local_90.m_backend.data._M_elems[0xc];
          uVar11._4_4_ = local_90.m_backend.data._M_elems[0xd];
          uVar12._0_4_ = local_90.m_backend.data._M_elems[0xe];
          uVar12._4_4_ = local_90.m_backend.data._M_elems[0xf];
          local_e8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
          local_e8.data._M_elems[1] = local_90.m_backend.data._M_elems[1];
          local_e8.data._M_elems[2] = local_90.m_backend.data._M_elems[2];
          local_e8.data._M_elems[3] = local_90.m_backend.data._M_elems[3];
          local_e8.data._M_elems[0xc] = local_90.m_backend.data._M_elems[0xc];
          local_e8.data._M_elems[0xd] = local_90.m_backend.data._M_elems[0xd];
          local_e8.data._M_elems[0xe] = local_90.m_backend.data._M_elems[0xe];
          local_e8.data._M_elems[0xf] = local_90.m_backend.data._M_elems[0xf];
          local_e8.data._M_elems[8] = local_90.m_backend.data._M_elems[8];
          local_e8.data._M_elems[9] = local_90.m_backend.data._M_elems[9];
          local_e8.data._M_elems[10] = local_90.m_backend.data._M_elems[10];
          local_e8.data._M_elems[0xb] = local_90.m_backend.data._M_elems[0xb];
          local_e8.data._M_elems[4] = local_90.m_backend.data._M_elems[4];
          local_e8.data._M_elems[5] = local_90.m_backend.data._M_elems[5];
          local_e8.data._M_elems[6] = local_90.m_backend.data._M_elems[6];
          local_e8.data._M_elems[7] = local_90.m_backend.data._M_elems[7];
          local_e8.exp = local_90.m_backend.exp;
          local_e8.neg = local_90.m_backend.neg;
          uVar13._0_4_ = local_90.m_backend.fpclass;
          uVar13._4_4_ = local_90.m_backend.prec_elem;
          local_e8.fpclass = local_90.m_backend.fpclass;
          local_e8.prec_elem = local_90.m_backend.prec_elem;
          if (uVar4 != 0 || fVar15 != cpp_dec_float_finite) {
            local_e8.neg = (bool)(local_90.m_backend.neg ^ 1);
          }
          if (((fVar15 != cpp_dec_float_NaN) &&
              (uVar5 = local_e8.data._M_elems._0_8_, uVar6 = local_e8.data._M_elems._8_8_,
              uVar7 = local_e8.data._M_elems._16_8_, uVar8 = local_e8.data._M_elems._24_8_,
              uVar9 = local_e8.data._M_elems._32_8_, uVar10 = local_e8.data._M_elems._40_8_,
              uVar11 = local_e8.data._M_elems._48_8_, uVar12 = local_e8.data._M_elems._56_8_,
              uVar13 = local_e8._72_8_, pcVar16->fpclass != cpp_dec_float_NaN)) &&
             (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (pcVar16,&local_e8), uVar5 = local_e8.data._M_elems._0_8_,
             uVar6 = local_e8.data._M_elems._8_8_, uVar7 = local_e8.data._M_elems._16_8_,
             uVar8 = local_e8.data._M_elems._24_8_, uVar9 = local_e8.data._M_elems._32_8_,
             uVar10 = local_e8.data._M_elems._40_8_, uVar11 = local_e8.data._M_elems._48_8_,
             uVar12 = local_e8.data._M_elems._56_8_, uVar13 = local_e8._72_8_, iVar14 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       &(this->theTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
            uVar5 = local_e8.data._M_elems._0_8_;
            uVar6 = local_e8.data._M_elems._8_8_;
            uVar7 = local_e8.data._M_elems._16_8_;
            uVar8 = local_e8.data._M_elems._24_8_;
            uVar9 = local_e8.data._M_elems._32_8_;
            uVar10 = local_e8.data._M_elems._40_8_;
            uVar11 = local_e8.data._M_elems._48_8_;
            uVar12 = local_e8.data._M_elems._56_8_;
            uVar13 = local_e8._72_8_;
          }
        }
      }
      else {
        (this->isInfeasibleCo).data[i] = 0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&(this->theTest).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,0);
        uVar5 = local_e8.data._M_elems._0_8_;
        uVar6 = local_e8.data._M_elems._8_8_;
        uVar7 = local_e8.data._M_elems._16_8_;
        uVar8 = local_e8.data._M_elems._24_8_;
        uVar9 = local_e8.data._M_elems._32_8_;
        uVar10 = local_e8.data._M_elems._40_8_;
        uVar11 = local_e8.data._M_elems._48_8_;
        uVar12 = local_e8.data._M_elems._56_8_;
        uVar13 = local_e8._72_8_;
      }
      local_e8._72_8_ = uVar13;
      local_e8.data._M_elems._56_8_ = uVar12;
      local_e8.data._M_elems._48_8_ = uVar11;
      local_e8.data._M_elems._40_8_ = uVar10;
      local_e8.data._M_elems._32_8_ = uVar9;
      local_e8.data._M_elems._24_8_ = uVar8;
      local_e8.data._M_elems._16_8_ = uVar7;
      local_e8.data._M_elems._8_8_ = uVar6;
      local_e8.data._M_elems._0_8_ = uVar5;
      lVar17 = lVar17 + -1;
    } while (1 < lVar17);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateTest()
{
   thePvec->delta().setup();

   const IdxSet& idx = thePvec->idx();
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();

   int i;
   updateViolsCo.clear();

   for(i = idx.size() - 1; i >= 0; --i)
   {
      int j = idx.index(i);
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(j);

      if(!isBasic(stat))
      {
         if(m_pricingViolCoUpToDate && theTest[j] < -pricingTol)
            m_pricingViolCo += theTest[j];

         theTest[j] = test(j, stat);

         if(sparsePricingEnterCo)
         {
            if(theTest[j] < -pricingTol)
            {
               assert(remainingRoundsEnterCo == 0);
               m_pricingViolCo -= theTest[j];

               if(isInfeasibleCo[j] == SPxPricer<R>::NOT_VIOLATED)
               {
                  infeasibilitiesCo.addIdx(j);
                  isInfeasibleCo[j] = SPxPricer<R>::VIOLATED;
               }

               if(hyperPricingEnter)
                  updateViolsCo.addIdx(j);
            }
            else
            {
               isInfeasibleCo[j] = SPxPricer<R>::NOT_VIOLATED;
            }
         }
         else if(theTest[j] < -pricingTol)
            m_pricingViolCo -= theTest[j];
      }
      else
      {
         isInfeasibleCo[j] = SPxPricer<R>::NOT_VIOLATED;
         theTest[j] = 0;
      }
   }
}